

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::AuthenticatedStream> * __thiscall
kj::_::NullableValue<kj::AuthenticatedStream>::operator=
          (NullableValue<kj::AuthenticatedStream> *this,
          NullableValue<kj::AuthenticatedStream> *other)

{
  AuthenticatedStream *params;
  NullableValue<kj::AuthenticatedStream> *other_local;
  NullableValue<kj::AuthenticatedStream> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::AuthenticatedStream>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::AuthenticatedStream>(&(other->field_1).value);
      ctor<kj::AuthenticatedStream,kj::AuthenticatedStream>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }